

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void * __thiscall
google::protobuf::FileDescriptorTables::FindParentForFieldsByMap
          (FileDescriptorTables *this,FieldDescriptor *field)

{
  long lStack_8;
  
  if (field[0x42] == (FieldDescriptor)0x1) {
    if (*(void **)(field + 0x60) != (void *)0x0) {
      return *(void **)(field + 0x60);
    }
    lStack_8 = 0x28;
  }
  else {
    lStack_8 = 0x50;
  }
  return *(void **)(field + lStack_8);
}

Assistant:

const void* FileDescriptorTables::FindParentForFieldsByMap(
    const FieldDescriptor* field) const {
  if (field->is_extension()) {
    if (field->extension_scope() == nullptr) {
      return field->file();
    } else {
      return field->extension_scope();
    }
  } else {
    return field->containing_type();
  }
}